

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O2

UTrie2 * utrie2_openFromSerialized_63
                   (UTrie2ValueBits valueBits,void *data,int32_t length,int32_t *pActualLength,
                   UErrorCode *pErrorCode)

{
  undefined4 uVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  UTrie2 *pUVar5;
  uint32_t *puVar6;
  uint32_t *puVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  int iVar10;
  uint uVar11;
  uint16_t local_48;
  ushort uStack_46;
  
  if (U_ZERO_ERROR < *pErrorCode) {
    return (UTrie2 *)0x0;
  }
  if ((length < 1) || (UTRIE2_32_VALUE_BITS < valueBits || ((ulong)data & 3) != 0)) {
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
  }
  else {
    if (((0xf < (uint)length) && (*data == 0x54726932)) &&
       ((*(ushort *)((long)data + 4) & 0xf) == valueBits)) {
      uVar11 = (uint)*(ushort *)((long)data + 6);
      uVar2 = *(ushort *)((long)data + 8);
      iVar10 = -4;
      if (valueBits == UTRIE2_16_VALUE_BITS) {
        iVar10 = *(ushort *)((long)data + 6) - 4;
      }
      uVar4 = ((uint)uVar2 << (4U - (valueBits == UTRIE2_16_VALUE_BITS) & 0x1f)) + uVar11 * 2 + 0x10
      ;
      if (uVar4 <= (uint)length) {
        uVar1 = *(undefined4 *)((long)data + 10);
        uVar3 = *(ushort *)((long)data + 0xe);
        pUVar5 = (UTrie2 *)uprv_malloc_63(0x50);
        if (pUVar5 == (UTrie2 *)0x0) {
          *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
          return (UTrie2 *)0x0;
        }
        pUVar5->indexLength = uVar11;
        pUVar5->dataLength = (uint)uVar2 << 2;
        local_48 = (uint16_t)uVar1;
        uStack_46 = (ushort)((uint)uVar1 >> 0x10);
        pUVar5->index2NullOffset = local_48;
        pUVar5->dataNullOffset = uStack_46;
        pUVar5->highStart = (uint)uVar3 << 0xb;
        pUVar5->highValueIndex = iVar10 + (uint)uVar2 * 4;
        *(undefined8 *)&pUVar5->field_0x34 = 0;
        *(undefined8 *)((long)&pUVar5->memory + 4) = 0;
        pUVar5->length = 0;
        pUVar5->isMemoryOwned = '\0';
        pUVar5->padding1 = '\0';
        pUVar5->padding2 = 0;
        pUVar5->newTrie = (UNewTrie2 *)0x0;
        pUVar5->memory = data;
        pUVar5->length = uVar4;
        pUVar5->index = (uint16_t *)((long)data + 0x10);
        puVar6 = (uint32_t *)((long)data + (ulong)uVar11 * 2 + 0x10);
        if ((valueBits & UTRIE2_32_VALUE_BITS) == UTRIE2_16_VALUE_BITS) {
          uVar8 = (uint32_t)((uint16_t *)((long)data + 0x10))[uStack_46];
          uVar9 = (uint32_t)*(ushort *)((long)data + (ulong)uVar11 * 2 + 0x110);
          puVar7 = (uint32_t *)0x0;
        }
        else {
          uVar8 = puVar6[uStack_46];
          uVar9 = *(uint32_t *)((long)data + (ulong)uVar11 * 2 + 0x210);
          puVar7 = puVar6;
          puVar6 = (uint32_t *)0x0;
        }
        pUVar5->data16 = (uint16_t *)puVar6;
        pUVar5->data32 = puVar7;
        pUVar5->initialValue = uVar8;
        pUVar5->errorValue = uVar9;
        if (pActualLength != (int32_t *)0x0) {
          *pActualLength = uVar4;
          return pUVar5;
        }
        return pUVar5;
      }
    }
    *pErrorCode = U_INVALID_FORMAT_ERROR;
  }
  return (UTrie2 *)0x0;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }